

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O1

void __thiscall
omp_tuple_map_tuple_type_depends_on_functor_res_Test::
~omp_tuple_map_tuple_type_depends_on_functor_res_Test
          (omp_tuple_map_tuple_type_depends_on_functor_res_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(omp_tuple_map_tuple, type_depends_on_functor_res) {
  auto expected1 = std::make_tuple(1, 2.0f, 'a', 4, 5);

  auto result = omp::tuple_map(DummyFunctor(), expected1);

  auto t_frst =
      std::is_same_v<int &, std::tuple_element_t<0, decltype(result)>>;
  auto t_scnd =
      std::is_same_v<float, std::tuple_element_t<1, decltype(result)>>;
  auto t_thrd =
      std::is_same_v<char &&, std::tuple_element_t<2, decltype(result)>>;
  auto t_frth =
      std::is_same_v<int &, std::tuple_element_t<3, decltype(result)>>;
  auto t_ffth =
      std::is_same_v<int &, std::tuple_element_t<4, decltype(result)>>;

  ASSERT_TRUE(t_frst && t_scnd && t_thrd && t_frth && t_ffth);
}